

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcSocket.cpp
# Opt level: O0

int XmlRpc::XmlRpcSocket::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  sockaddr_in *address_1;
  sockaddr_in6 *address;
  socklen_t ss_len;
  sockaddr_storage ss;
  socklen_t local_8c;
  sockaddr local_88;
  undefined8 local_78;
  undefined4 local_8;
  int local_4;
  
  local_8 = SUB84(__addr,0);
  local_4 = __fd;
  memset(&local_88,0,0x80);
  if ((s_use_ipv6_ & 1U) == 0) {
    local_8c = 0x10;
    local_88.sa_family = 2;
    local_88.sa_data._2_4_ = htonl(0);
    local_88.sa_data._0_2_ = htons((uint16_t)local_8);
  }
  else {
    local_8c = 0x1c;
    local_88.sa_family = 10;
    local_88.sa_data[6] = in6addr_any;
    local_88.sa_data[7] = in6addr_any_1;
    local_88.sa_data[8] = cRam0000000000645772;
    local_88.sa_data[9] = cRam0000000000645773;
    local_88.sa_data[10] = cRam0000000000645774;
    local_88.sa_data[0xb] = cRam0000000000645775;
    local_88.sa_data[0xc] = cRam0000000000645776;
    local_88.sa_data[0xd] = cRam0000000000645777;
    local_78 = _pthread_rwlock_wrlock;
    local_88.sa_data._0_2_ = htons((uint16_t)local_8);
  }
  iVar1 = ::bind(local_4,&local_88,local_8c);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0);
}

Assistant:

bool
XmlRpcSocket::bind(int fd, int port)
{
  sockaddr_storage ss;
  socklen_t ss_len;
  memset(&ss, 0, sizeof(ss));

  if (s_use_ipv6_)
  {
    sockaddr_in6 *address = (sockaddr_in6 *)&ss;
    ss_len = sizeof(sockaddr_in6);

    address->sin6_family = AF_INET6;
    address->sin6_addr = in6addr_any;
    address->sin6_port = htons((u_short) port);
  }
  else
  {
    sockaddr_in *address = (sockaddr_in *)&ss;
    ss_len = sizeof(sockaddr_in);

    address->sin_family = AF_INET;
    address->sin_addr.s_addr = htonl(INADDR_ANY);
    address->sin_port = htons((u_short) port);
  }

  return (::bind(fd, (sockaddr*)&ss, ss_len) == 0);
}